

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O0

type calcGrad(Mesh *mesh,VectorXd *x,double epsilon)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  reference pvVar4;
  float *pfVar5;
  reference pvVar6;
  CoeffReturnType pdVar7;
  CoeffReturnType pdVar8;
  double *pdVar9;
  pointer ppVar10;
  Scalar *pSVar11;
  Index extraout_RDX;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  pair<std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>_>
  pVar18;
  type tVar19;
  vector_type vVar20;
  type tVar21;
  type normal;
  double projected_1;
  Vec2d dir_u1;
  Vec2d dir_ui_1;
  Vec2d dir_u2;
  Vec2d dir_ui;
  double dis_1;
  Vec2d u2_1;
  Vec2d u1_1;
  Vec2d ui;
  Vec2d grad_maxu2;
  Vec2d grad_maxu1;
  Vec2d grad_maxui;
  double dis;
  double projected;
  Vec2d point;
  _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true> itr_1;
  pair<std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>_>
  itr_pr;
  int y;
  int xs;
  int y_end;
  int y_st;
  int x_end;
  int x_st;
  Vec2d edge;
  Vec2d pend;
  Vec2d pst;
  int end;
  int st;
  int ui_idx;
  double seng;
  value_type e;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
  __end1_1;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
  __begin1_1;
  ConstEdgeRange *__range1_1;
  int cnt;
  Vec2d dE_du2;
  Vec3d dterm2_du2;
  Vec2d dterm1_du2;
  Vec2d height_2;
  Vec2d dE_du1;
  Vec3d dterm2_du1;
  Vec2d dterm1_du1;
  Vec2d height_1;
  Vec2d dE_du0;
  Vec3d dterm2_du0;
  Vec2d dterm1_du0;
  Vec2d height;
  double term2;
  double term1;
  double cot2;
  double cot1;
  double cot0;
  double sp;
  double su;
  Vec3d pe2;
  Vec3d pe1;
  Vec3d p2;
  Vec3d p1;
  Vec3d p0;
  Vec3d ue2;
  Vec3d ue1;
  Vec3d u2;
  Vec3d u1;
  Vec3d u0;
  ConstFaceVertexCCWIter itr;
  int i;
  VertexHandle vs [3];
  value_type f;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  __end1;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  __begin1;
  ConstFaceRange *__range1;
  VectorXd gradx;
  undefined4 in_stack_ffffffffffffe938;
  int in_stack_ffffffffffffe93c;
  PolyConnectivity *in_stack_ffffffffffffe940;
  ArrayKernel *in_stack_ffffffffffffe948;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_ffffffffffffe950;
  PolyConnectivity *in_stack_ffffffffffffe958;
  VectorT<double,_3> *in_stack_ffffffffffffe960;
  double in_stack_ffffffffffffe990;
  VectorXd *in_stack_ffffffffffffe998;
  Mesh *in_stack_ffffffffffffe9a0;
  VertexHandle *in_stack_ffffffffffffea78;
  EdgeHandle *in_stack_ffffffffffffea80;
  VectorXd *in_stack_ffffffffffffea88;
  Mesh *in_stack_ffffffffffffea90;
  BaseHandle *local_c50;
  VectorT<double,2> local_988 [16];
  VectorT<double,_2> local_978;
  VectorT<double,_2> local_968;
  VectorT<double,_2> local_958;
  double local_940;
  double local_938 [2];
  double local_928;
  double local_920;
  double local_918;
  double local_910;
  VectorT<double,2> local_908 [16];
  _Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true> local_8f8;
  VectorT<int,2> local_8f0 [8];
  _Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true> local_8e8;
  _Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true> local_8e0;
  int local_8d8;
  int local_8d4;
  int local_8d0;
  int local_8cc;
  int local_8c8;
  int local_8c4;
  double local_8c0;
  double local_8b8;
  VectorT<double,2> local_8b0 [16];
  VectorT<double,2> local_8a0 [20];
  int local_88c;
  BaseHandle local_888;
  BaseHandle local_884;
  int local_880;
  int local_87c;
  BaseHandle local_878;
  BaseHandle local_874;
  int local_870;
  int local_86c;
  double local_868;
  int local_860;
  int local_85c;
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  PolyConnectivity *local_838;
  PolyConnectivity **local_830;
  undefined4 local_824;
  VectorT<double,2> local_820 [16];
  double local_810;
  double local_808;
  double local_800;
  double local_7f8;
  double local_7f0;
  double local_7e8;
  double local_7e0;
  double local_7a8;
  double local_758;
  double local_750;
  double local_748;
  double local_740;
  double local_738;
  VectorT<double,3> local_718 [72];
  double local_6d0;
  double local_6c8;
  VectorT<double,2> local_6c0 [16];
  double local_6b0;
  double local_6a8;
  double local_6a0;
  double local_698;
  double local_690;
  double local_688;
  double local_680;
  double local_648;
  double local_5f8;
  double local_5f0;
  double local_5e8;
  double local_5e0;
  double local_5d8;
  VectorT<double,3> local_5b8 [72];
  double local_570;
  double local_568;
  VectorT<double,2> local_560 [16];
  double local_550;
  double local_548;
  double local_540;
  double local_538;
  double local_530;
  double local_528;
  double local_520;
  double local_4e8;
  double local_498;
  double local_490;
  double local_488;
  double local_480;
  double local_478;
  VectorT<double,3> local_458 [72];
  double local_410;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_358;
  double local_2d8;
  double local_258;
  double local_238;
  undefined4 local_22c;
  double local_210;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  VectorT<double,3> local_1c8 [28];
  undefined4 local_1ac;
  undefined4 local_1a8;
  undefined4 local_1a4;
  VectorT<double,3> local_1a0 [28];
  int local_184;
  int local_180;
  int local_17c;
  VectorT<double,3> local_178 [72];
  VectorT<double,3> local_130 [24];
  VectorT<double,3> local_118 [24];
  VectorT<double,3> local_100 [48];
  BaseHandle local_d0;
  int local_cc;
  int local_ac;
  int local_8c;
  BaseHandle local_88 [4];
  undefined1 local_78 [16];
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  local_68 [16];
  PolyConnectivity *local_58;
  PolyConnectivity **local_50;
  Index local_38;
  double local_20;
  
  local_20 = in_XMM0_Qa;
  initHashMap(in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998,in_stack_ffffffffffffe990);
  local_38 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                       ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        in_stack_ffffffffffffe940);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            (in_stack_ffffffffffffe950,(long *)in_stack_ffffffffffffe948);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffe940);
  local_58 = (PolyConnectivity *)
             OpenMesh::PolyConnectivity::all_faces
                       ((PolyConnectivity *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
  local_50 = &local_58;
  local_68 = (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
               [16])OpenMesh::PolyConnectivity::
                    EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>,_&OpenMesh::PolyConnectivity::faces_begin,_&OpenMesh::PolyConnectivity::faces_end>
                    ::begin((EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>,_&OpenMesh::PolyConnectivity::faces_begin,_&OpenMesh::PolyConnectivity::faces_end>
                             *)in_stack_ffffffffffffe940);
  local_78 = OpenMesh::PolyConnectivity::
             EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>,_&OpenMesh::PolyConnectivity::faces_begin,_&OpenMesh::PolyConnectivity::faces_end>
             ::end((EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>,_&OpenMesh::PolyConnectivity::faces_begin,_&OpenMesh::PolyConnectivity::faces_end>
                    *)in_stack_ffffffffffffe940);
  do {
    bVar3 = OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
            ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)in_stack_ffffffffffffe940,
                         (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    if (!bVar3) {
      local_824 = 0;
      local_838 = (PolyConnectivity *)
                  OpenMesh::PolyConnectivity::all_edges
                            ((PolyConnectivity *)
                             CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
      local_830 = &local_838;
      local_848 = OpenMesh::PolyConnectivity::
                  EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>,_&OpenMesh::PolyConnectivity::edges_begin,_&OpenMesh::PolyConnectivity::edges_end>
                  ::begin((EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>,_&OpenMesh::PolyConnectivity::edges_begin,_&OpenMesh::PolyConnectivity::edges_end>
                           *)in_stack_ffffffffffffe940);
      local_858 = OpenMesh::PolyConnectivity::
                  EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>,_&OpenMesh::PolyConnectivity::edges_begin,_&OpenMesh::PolyConnectivity::edges_end>
                  ::end((EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>,_&OpenMesh::PolyConnectivity::edges_begin,_&OpenMesh::PolyConnectivity::edges_end>
                         *)in_stack_ffffffffffffe940);
      while( true ) {
        bVar3 = OpenMesh::Iterators::
                GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                              *)in_stack_ffffffffffffe940,
                             (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                              *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
        if (!bVar3) break;
        pvVar6 = OpenMesh::Iterators::
                 GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                 ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                              *)local_848);
        local_860 = (pvVar6->super_BaseHandle).idx_;
        local_85c = local_860;
        bVar3 = OpenMesh::PolyConnectivity::is_boundary
                          (in_stack_ffffffffffffe958,
                           (BaseHandle)(int)((ulong)in_stack_ffffffffffffe960 >> 0x20));
        if (bVar3) {
          local_868 = 0.0;
          local_86c = -1;
          local_87c = local_85c;
          local_878.idx_ =
               (int)OpenMesh::ArrayKernel::halfedge_handle
                              ((ArrayKernel *)
                               CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938),
                               (BaseHandle)(int)in_stack_ffffffffffffe940,0);
          local_874.idx_ =
               (int)OpenMesh::ArrayKernel::to_vertex_handle
                              ((ArrayKernel *)
                               CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938),
                               (BaseHandle)(int)in_stack_ffffffffffffe940);
          local_870 = OpenMesh::BaseHandle::idx(&local_874);
          local_88c = local_85c;
          local_888.idx_ =
               (int)OpenMesh::ArrayKernel::halfedge_handle
                              ((ArrayKernel *)
                               CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938),
                               (BaseHandle)(int)in_stack_ffffffffffffe940,0);
          local_884.idx_ =
               (int)OpenMesh::ArrayKernel::from_vertex_handle
                              (in_stack_ffffffffffffe948,(BaseHandle)(int)in_stack_ffffffffffffe950)
          ;
          local_880 = OpenMesh::BaseHandle::idx(&local_884);
          pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                              in_stack_ffffffffffffe940,
                              CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
          dVar15 = *pdVar7;
          pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                              in_stack_ffffffffffffe940,
                              CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
          OpenMesh::VectorT<double,2>::VectorT<double,double,void,void>(local_8a0,dVar15,*pdVar7);
          pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                              in_stack_ffffffffffffe940,
                              CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
          dVar15 = *pdVar7;
          pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                              in_stack_ffffffffffffe940,
                              CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
          OpenMesh::VectorT<double,2>::VectorT<double,double,void,void>(local_8b0,dVar15,*pdVar7);
          tVar21 = OpenMesh::VectorT<double,2>::operator-
                             ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                              (VectorT<double,_2> *)in_stack_ffffffffffffe940);
          local_8c0 = tVar21.values_._M_elems[0];
          local_8b8 = tVar21.values_._M_elems[1];
          pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                              in_stack_ffffffffffffe940,
                              CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
          pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                              in_stack_ffffffffffffe940,
                              CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
          pdVar9 = std::min<double>(pdVar7,pdVar8);
          local_8c4 = (int)(*pdVar9 / local_20 + -1.0);
          pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                              in_stack_ffffffffffffe940,
                              CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
          pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                              in_stack_ffffffffffffe940,
                              CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
          pdVar9 = std::max<double>(pdVar7,pdVar8);
          local_8c8 = (int)(*pdVar9 / local_20 + 1.0);
          pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                              in_stack_ffffffffffffe940,
                              CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
          pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                              in_stack_ffffffffffffe940,
                              CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
          pdVar9 = std::min<double>(pdVar7,pdVar8);
          local_8cc = (int)(*pdVar9 / local_20 + -1.0);
          pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                              in_stack_ffffffffffffe940,
                              CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
          pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                              in_stack_ffffffffffffe940,
                              CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
          pdVar9 = std::max<double>(pdVar7,pdVar8);
          local_8d0 = (int)(*pdVar9 / local_20 + 1.0);
          for (local_8d4 = local_8c4; local_8d4 <= local_8c8; local_8d4 = local_8d4 + 1) {
            for (local_8d8 = local_8cc; local_8d8 <= local_8d0; local_8d8 = local_8d8 + 1) {
              OpenMesh::VectorT<int,2>::VectorT<int,int,void,void>(local_8f0,local_8d4,local_8d8);
              pVar18 = std::
                       unordered_multimap<OpenMesh::VectorT<int,_2>,_int,_myHash,_std::equal_to<OpenMesh::VectorT<int,_2>_>,_std::allocator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>_>
                       ::equal_range((unordered_multimap<OpenMesh::VectorT<int,_2>,_int,_myHash,_std::equal_to<OpenMesh::VectorT<int,_2>_>,_std::allocator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>_>_>
                                      *)in_stack_ffffffffffffe940,
                                     (key_type *)
                                     CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
              local_8e8._M_cur =
                   (__node_type *)
                   pVar18.first.
                   super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>.
                   _M_cur;
              while( true ) {
                local_8e0._M_cur =
                     (__node_type *)
                     pVar18.second.
                     super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                     ._M_cur;
                local_8f8._M_cur =
                     (__node_type *)
                     pVar18.first.
                     super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                     ._M_cur;
                bVar3 = std::__detail::operator!=(&local_8f8,&local_8e0);
                if (!bVar3) break;
                ppVar10 = std::__detail::
                          _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>
                          ::operator->((_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>
                                        *)0x1cf5ab);
                if (ppVar10->second != local_870) {
                  ppVar10 = std::__detail::
                            _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>
                            ::operator->((_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>
                                          *)0x1cf5c8);
                  if (ppVar10->second != local_880) {
                    std::__detail::
                    _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>::
                    operator->((_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>
                                *)0x1cf5f5);
                    pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                             operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                         *)in_stack_ffffffffffffe940,
                                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938
                                                ));
                    dVar15 = *pdVar7;
                    std::__detail::
                    _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>::
                    operator->((_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>
                                *)0x1cf646);
                    pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                             operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                         *)in_stack_ffffffffffffe940,
                                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938
                                                ));
                    OpenMesh::VectorT<double,2>::VectorT<double,double,void,void>
                              (local_908,dVar15,*pdVar7);
                    tVar21 = OpenMesh::VectorT<double,2>::operator-
                                       ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                        (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                    local_920 = tVar21.values_._M_elems[0];
                    local_918 = tVar21.values_._M_elems[1];
                    dVar15 = OpenMesh::dot<double,2>
                                       ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                        (VectorT<double,_2> *)
                                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938
                                                ));
                    local_910 = OpenMesh::VectorT<double,_2>::norm<double>
                                          ((VectorT<double,_2> *)0x1cf707);
                    local_910 = dVar15 / local_910;
                    std::__detail::
                    _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>::
                    operator->((_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>
                                *)0x1cf75e);
                    OpenMesh::VertexHandle::VertexHandle
                              ((VertexHandle *)in_stack_ffffffffffffe940,in_stack_ffffffffffffe93c);
                    local_928 = getDistance(in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,
                                            in_stack_ffffffffffffea80,in_stack_ffffffffffffea78);
                    if ((local_928 == 0.0) && (!NAN(local_928))) {
                      dVar15 = std::numeric_limits<double>::infinity();
                      pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                                operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                            *)in_stack_ffffffffffffe940,
                                           CONCAT44(in_stack_ffffffffffffe93c,
                                                    in_stack_ffffffffffffe938));
                      *pSVar11 = dVar15;
                      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                                ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffe940,
                                 (Matrix<double,__1,_1,_0,__1,_1> *)
                                 CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
                      goto LAB_001d0ef9;
                    }
                    local_938[0] = 0.0;
                    local_940 = local_20 / local_928 + -1.0;
                    pdVar9 = std::max<double>(local_938,&local_940);
                    local_868 = *pdVar9;
                    ppVar10 = std::__detail::
                              _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>
                              ::operator->((_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>
                                            *)0x1cf8a1);
                    local_86c = ppVar10->second;
                    if ((local_86c != -1) && ((local_868 != 0.0 || (NAN(local_868))))) {
                      OpenMesh::VectorT<double,_2>::VectorT(&local_958);
                      OpenMesh::VectorT<double,_2>::VectorT(&local_968);
                      OpenMesh::VectorT<double,_2>::VectorT(&local_978);
                      pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                               operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                           *)in_stack_ffffffffffffe940,
                                          CONCAT44(in_stack_ffffffffffffe93c,
                                                   in_stack_ffffffffffffe938));
                      dVar15 = *pdVar7;
                      pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::
                               operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                                           *)in_stack_ffffffffffffe940,
                                          CONCAT44(in_stack_ffffffffffffe93c,
                                                   in_stack_ffffffffffffe938));
                      OpenMesh::VectorT<double,2>::VectorT<double,double,void,void>
                                (local_988,dVar15,*pdVar7);
                      OpenMesh::VectorT<double,2>::operator-
                                ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                 (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                      OpenMesh::VectorT<double,2>::operator-
                                ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                 (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                      dVar15 = OpenMesh::dot<double,2>
                                         ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                          (VectorT<double,_2> *)
                                          CONCAT44(in_stack_ffffffffffffe93c,
                                                   in_stack_ffffffffffffe938));
                      dVar15 = sqrt(dVar15 - local_910 * local_910);
                      OpenMesh::VectorT<double,2>::operator-
                                ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                 (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                      OpenMesh::VectorT<double,2>::operator-
                                ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                 (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                      dVar16 = OpenMesh::dot<double,2>
                                         ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                          (VectorT<double,_2> *)
                                          CONCAT44(in_stack_ffffffffffffe93c,
                                                   in_stack_ffffffffffffe938));
                      if (0.0 <= dVar16) {
                        OpenMesh::VectorT<double,2>::operator-
                                  ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                   (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                        OpenMesh::VectorT<double,2>::operator-
                                  ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                   (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                        dVar16 = OpenMesh::dot<double,2>
                                           ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                            (VectorT<double,_2> *)
                                            CONCAT44(in_stack_ffffffffffffe93c,
                                                     in_stack_ffffffffffffe938));
                        if (0.0 <= dVar16) {
                          OpenMesh::VectorT<double,2>::operator-
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                     (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          OpenMesh::VectorT<double,2>::operator-
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                     (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          OpenMesh::dot<double,2>
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                     (VectorT<double,_2> *)
                                     CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
                          OpenMesh::VectorT<double,_2>::norm<double>((VectorT<double,_2> *)0x1d0509)
                          ;
                          OpenMesh::VectorT<double,2>::operator-
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                     (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          OpenMesh::VectorT<double,2>::operator-
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                     (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          OpenMesh::VectorT<double,_2>::normalize<double>
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          OpenMesh::VectorT<double,2>::operator*
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                     (double *)in_stack_ffffffffffffe940);
                          OpenMesh::VectorT<double,2>::operator-
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                     (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          OpenMesh::VectorT<double,_2>::normalize<double>
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          OpenMesh::VectorT<double,2>::operator-
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                     (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          OpenMesh::VectorT<double,2>::operator-
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                     (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          in_stack_ffffffffffffea90 =
                               (Mesh *)OpenMesh::dot<double,2>
                                                 ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                                  (VectorT<double,_2> *)
                                                  CONCAT44(in_stack_ffffffffffffe93c,
                                                           in_stack_ffffffffffffe938));
                          tVar21 = OpenMesh::operator*((double *)in_stack_ffffffffffffe940,
                                                       (VectorT<double,_2> *)
                                                       CONCAT44(in_stack_ffffffffffffe93c,
                                                                in_stack_ffffffffffffe938));
                          in_stack_ffffffffffffea88 = tVar21.values_._M_elems[0];
                          in_stack_ffffffffffffea80 = tVar21.values_._M_elems[1];
                          tVar21 = OpenMesh::VectorT<double,2>::operator/
                                             ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                              (double *)in_stack_ffffffffffffe940);
                          in_stack_ffffffffffffea78 = tVar21.values_._M_elems[0];
                          local_978.values_._M_elems[1] = tVar21.values_._M_elems[1];
                          local_978.values_._M_elems[0] = (double)in_stack_ffffffffffffea78;
                          pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                                             ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                              CONCAT44(in_stack_ffffffffffffe93c,
                                                       in_stack_ffffffffffffe938));
                          dVar15 = *pdVar9;
                          pSVar11 = Eigen::
                                    DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                                    operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                                *)in_stack_ffffffffffffe940,
                                               CONCAT44(in_stack_ffffffffffffe93c,
                                                        in_stack_ffffffffffffe938));
                          *pSVar11 = *pSVar11 + dVar15;
                          pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                                             ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                              CONCAT44(in_stack_ffffffffffffe93c,
                                                       in_stack_ffffffffffffe938));
                          dVar15 = *pdVar9;
                          pSVar11 = Eigen::
                                    DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                                    operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                                *)in_stack_ffffffffffffe940,
                                               CONCAT44(in_stack_ffffffffffffe93c,
                                                        in_stack_ffffffffffffe938));
                          *pSVar11 = *pSVar11 + dVar15;
                          OpenMesh::VectorT<double,2>::operator-
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                     (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          OpenMesh::VectorT<double,2>::operator-
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                     (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          OpenMesh::dot<double,2>
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                     (VectorT<double,_2> *)
                                     CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
                          OpenMesh::VectorT<double,_2>::norm<double>((VectorT<double,_2> *)0x1d0a25)
                          ;
                          OpenMesh::VectorT<double,2>::operator-
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                     (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          OpenMesh::VectorT<double,2>::operator-
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                     (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          OpenMesh::dot<double,2>
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                     (VectorT<double,_2> *)
                                     CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
                          OpenMesh::operator*((double *)in_stack_ffffffffffffe940,
                                              (VectorT<double,_2> *)
                                              CONCAT44(in_stack_ffffffffffffe93c,
                                                       in_stack_ffffffffffffe938));
                          tVar21 = OpenMesh::VectorT<double,2>::operator/
                                             ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                              (double *)in_stack_ffffffffffffe940);
                          local_968.values_._M_elems[0] = tVar21.values_._M_elems[0];
                          local_968.values_._M_elems[1] = tVar21.values_._M_elems[1];
                          pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                                             ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                              CONCAT44(in_stack_ffffffffffffe93c,
                                                       in_stack_ffffffffffffe938));
                          dVar15 = *pdVar9;
                          pSVar11 = Eigen::
                                    DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                                    operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                                *)in_stack_ffffffffffffe940,
                                               CONCAT44(in_stack_ffffffffffffe93c,
                                                        in_stack_ffffffffffffe938));
                          *pSVar11 = *pSVar11 + dVar15;
                          pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                                             ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                              CONCAT44(in_stack_ffffffffffffe93c,
                                                       in_stack_ffffffffffffe938));
                          dVar15 = *pdVar9;
                          pSVar11 = Eigen::
                                    DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                                    operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                                *)in_stack_ffffffffffffe940,
                                               CONCAT44(in_stack_ffffffffffffe93c,
                                                        in_stack_ffffffffffffe938));
                          *pSVar11 = *pSVar11 + dVar15;
                          OpenMesh::operator*((double *)in_stack_ffffffffffffe940,
                                              (VectorT<double,_2> *)
                                              CONCAT44(in_stack_ffffffffffffe93c,
                                                       in_stack_ffffffffffffe938));
                          tVar21 = OpenMesh::VectorT<double,2>::operator/
                                             ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                              (double *)in_stack_ffffffffffffe940);
                          local_958.values_._M_elems[0] = tVar21.values_._M_elems[0];
                          local_958.values_._M_elems[1] = tVar21.values_._M_elems[1];
                          pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                                             ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                              CONCAT44(in_stack_ffffffffffffe93c,
                                                       in_stack_ffffffffffffe938));
                          in_stack_ffffffffffffe958 = (PolyConnectivity *)*pdVar9;
                          in_stack_ffffffffffffe960 =
                               (VectorT<double,_3> *)
                               Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                               operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                           *)in_stack_ffffffffffffe940,
                                          CONCAT44(in_stack_ffffffffffffe93c,
                                                   in_stack_ffffffffffffe938));
                          (in_stack_ffffffffffffe960->values_)._M_elems[0] =
                               (in_stack_ffffffffffffe960->values_)._M_elems[0] +
                               (double)in_stack_ffffffffffffe958;
                          in_stack_ffffffffffffe950 =
                               (Matrix<double,__1,_1,_0,__1,_1> *)
                               OpenMesh::VectorT<double,_2>::operator[]
                                         ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                          CONCAT44(in_stack_ffffffffffffe93c,
                                                   in_stack_ffffffffffffe938));
                          in_stack_ffffffffffffe940 =
                               (PolyConnectivity *)
                               (in_stack_ffffffffffffe950->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data;
                          in_stack_ffffffffffffe948 =
                               (ArrayKernel *)
                               Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                               operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                           *)in_stack_ffffffffffffe940,
                                          CONCAT44(in_stack_ffffffffffffe93c,
                                                   in_stack_ffffffffffffe938));
                          *(double *)in_stack_ffffffffffffe948 =
                               (double)in_stack_ffffffffffffe940 +
                               *(double *)in_stack_ffffffffffffe948;
                        }
                        else {
                          OpenMesh::VectorT<double,2>::operator-
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                     (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          OpenMesh::VectorT<double,_2>::normalize<double>
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          OpenMesh::VectorT<double,2>::operator-
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                     (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          OpenMesh::VectorT<double,_2>::normalize<double>
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe940);
                          OpenMesh::VectorT<double,_2>::operator-
                                    ((VectorT<double,_2> *)in_stack_ffffffffffffe960);
                          dVar17 = local_868 * -2.0 * local_20;
                          pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                                             ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                              CONCAT44(in_stack_ffffffffffffe93c,
                                                       in_stack_ffffffffffffe938));
                          dVar16 = *pdVar9;
                          pSVar11 = Eigen::
                                    DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                                    operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                                *)in_stack_ffffffffffffe940,
                                               CONCAT44(in_stack_ffffffffffffe93c,
                                                        in_stack_ffffffffffffe938));
                          *pSVar11 = *pSVar11 + (dVar17 * dVar16) / (dVar15 * dVar15);
                          dVar17 = local_868 * -2.0 * local_20;
                          pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                                             ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                              CONCAT44(in_stack_ffffffffffffe93c,
                                                       in_stack_ffffffffffffe938));
                          dVar16 = *pdVar9;
                          pSVar11 = Eigen::
                                    DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                                    operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                                *)in_stack_ffffffffffffe940,
                                               CONCAT44(in_stack_ffffffffffffe93c,
                                                        in_stack_ffffffffffffe938));
                          *pSVar11 = *pSVar11 + (dVar17 * dVar16) / (dVar15 * dVar15);
                          dVar17 = local_868 * -2.0 * local_20;
                          pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                                             ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                              CONCAT44(in_stack_ffffffffffffe93c,
                                                       in_stack_ffffffffffffe938));
                          dVar16 = *pdVar9;
                          pSVar11 = Eigen::
                                    DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                                    operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                                *)in_stack_ffffffffffffe940,
                                               CONCAT44(in_stack_ffffffffffffe93c,
                                                        in_stack_ffffffffffffe938));
                          *pSVar11 = *pSVar11 + (dVar17 * dVar16) / (dVar15 * dVar15);
                          dVar17 = local_868 * -2.0 * local_20;
                          pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                                             ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                              CONCAT44(in_stack_ffffffffffffe93c,
                                                       in_stack_ffffffffffffe938));
                          dVar16 = *pdVar9;
                          pSVar11 = Eigen::
                                    DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                                    operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                                *)in_stack_ffffffffffffe940,
                                               CONCAT44(in_stack_ffffffffffffe93c,
                                                        in_stack_ffffffffffffe938));
                          *pSVar11 = (dVar17 * dVar16) / (dVar15 * dVar15) + *pSVar11;
                        }
                      }
                      else {
                        OpenMesh::VectorT<double,2>::operator-
                                  ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                   (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                        OpenMesh::VectorT<double,_2>::normalize<double>
                                  ((VectorT<double,_2> *)in_stack_ffffffffffffe940);
                        OpenMesh::VectorT<double,2>::operator-
                                  ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                                   (VectorT<double,_2> *)in_stack_ffffffffffffe940);
                        OpenMesh::VectorT<double,_2>::normalize<double>
                                  ((VectorT<double,_2> *)in_stack_ffffffffffffe940);
                        OpenMesh::VectorT<double,_2>::operator-
                                  ((VectorT<double,_2> *)in_stack_ffffffffffffe960);
                        dVar17 = local_868 * -2.0 * local_20;
                        pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                                           ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                            CONCAT44(in_stack_ffffffffffffe93c,
                                                     in_stack_ffffffffffffe938));
                        dVar16 = *pdVar9;
                        pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
                                  ::operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                                *)in_stack_ffffffffffffe940,
                                               CONCAT44(in_stack_ffffffffffffe93c,
                                                        in_stack_ffffffffffffe938));
                        *pSVar11 = *pSVar11 + (dVar17 * dVar16) / (dVar15 * dVar15);
                        dVar17 = local_868 * -2.0 * local_20;
                        pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                                           ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                            CONCAT44(in_stack_ffffffffffffe93c,
                                                     in_stack_ffffffffffffe938));
                        dVar16 = *pdVar9;
                        pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
                                  ::operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                                *)in_stack_ffffffffffffe940,
                                               CONCAT44(in_stack_ffffffffffffe93c,
                                                        in_stack_ffffffffffffe938));
                        *pSVar11 = *pSVar11 + (dVar17 * dVar16) / (dVar15 * dVar15);
                        dVar17 = local_868 * -2.0 * local_20;
                        pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                                           ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                            CONCAT44(in_stack_ffffffffffffe93c,
                                                     in_stack_ffffffffffffe938));
                        dVar16 = *pdVar9;
                        pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
                                  ::operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                                *)in_stack_ffffffffffffe940,
                                               CONCAT44(in_stack_ffffffffffffe93c,
                                                        in_stack_ffffffffffffe938));
                        *pSVar11 = *pSVar11 + (dVar17 * dVar16) / (dVar15 * dVar15);
                        dVar17 = local_868 * -2.0 * local_20;
                        pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                                           ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                                            CONCAT44(in_stack_ffffffffffffe93c,
                                                     in_stack_ffffffffffffe938));
                        dVar16 = *pdVar9;
                        pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
                                  ::operator[]((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                                                *)in_stack_ffffffffffffe940,
                                               CONCAT44(in_stack_ffffffffffffe93c,
                                                        in_stack_ffffffffffffe938));
                        *pSVar11 = (dVar17 * dVar16) / (dVar15 * dVar15) + *pSVar11;
                      }
                    }
                  }
                }
                std::__detail::
                _Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>::
                operator++((_Node_iterator<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_false,_true>
                            *)in_stack_ffffffffffffe940);
                pVar18.second.
                super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>.
                _M_cur = (_Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                         )(_Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                           )local_8e0._M_cur;
                pVar18.first.
                super__Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>.
                _M_cur = (_Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                         )(_Node_iterator_base<std::pair<const_OpenMesh::VectorT<int,_2>,_int>,_true>
                           )local_8f8._M_cur;
              }
            }
          }
        }
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
        ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::EdgeHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_edge_status,_&OpenMesh::ArrayKernel::n_edges>
                      *)in_stack_ffffffffffffe940);
      }
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffe940,
                 (Matrix<double,__1,_1,_0,__1,_1> *)
                 CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
LAB_001d0ef9:
      local_22c = 1;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d0f06);
      tVar19.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           extraout_RDX;
      tVar19.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           in_RDI;
      return (type)tVar19.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
    }
    pvVar4 = OpenMesh::Iterators::
             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
             ::operator*(local_68);
    local_88[3].idx_ = (pvVar4->super_BaseHandle).idx_;
    local_c50 = local_88;
    do {
      OpenMesh::VertexHandle::VertexHandle
                ((VertexHandle *)in_stack_ffffffffffffe940,in_stack_ffffffffffffe93c);
      local_c50 = local_c50 + 1;
    } while (local_c50 != local_88 + 3);
    local_8c = 0;
    local_ac = local_88[3].idx_;
    OpenMesh::PolyConnectivity::cfv_ccwbegin
              (in_stack_ffffffffffffe940,(BaseHandle)(int)((ulong)in_stack_ffffffffffffe948 >> 0x20)
              );
    while( true ) {
      local_cc = local_88[3].idx_;
      OpenMesh::PolyConnectivity::cfv_ccwend
                (in_stack_ffffffffffffe940,
                 (BaseHandle)(int)((ulong)in_stack_ffffffffffffe948 >> 0x20));
      bVar3 = OpenMesh::Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle,_true>
              ::operator!=((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle,_true>
                            *)in_stack_ffffffffffffe940,
                           (GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle,_true>
                            *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
      if (!bVar3) break;
      local_d0.idx_ =
           (int)OpenMesh::Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle,_true>
                ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle,_true>
                             *)in_stack_ffffffffffffe948);
      local_88[local_8c].idx_ = local_d0.idx_;
      local_8c = local_8c + 1;
      OpenMesh::Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle,_true>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle,_true>
                    *)in_stack_ffffffffffffe948,(int)((ulong)in_stack_ffffffffffffe940 >> 0x20));
    }
    OpenMesh::BaseHandle::idx(local_88);
    pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar7;
    OpenMesh::BaseHandle::idx(local_88);
    pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::VectorT<double,double,double,void,void>
              (local_100,dVar15,*pdVar7,0.0);
    OpenMesh::BaseHandle::idx(local_88 + 1);
    pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar7;
    OpenMesh::BaseHandle::idx(local_88 + 1);
    pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::VectorT<double,double,double,void,void>
              (local_118,dVar15,*pdVar7,0.0);
    OpenMesh::BaseHandle::idx(local_88 + 2);
    pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar7;
    OpenMesh::BaseHandle::idx(local_88 + 2);
    pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::VectorT<double,double,double,void,void>
              (local_130,dVar15,*pdVar7,0.0);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    local_17c = local_88[0].idx_;
    OpenMesh::
    AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
             *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938),
            (BaseHandle)(int)((ulong)in_stack_ffffffffffffe940 >> 0x20));
    pfVar5 = OpenMesh::VectorT<float,_3>::operator[]
                       ((VectorT<float,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    fVar1 = *pfVar5;
    local_180 = local_88[0].idx_;
    OpenMesh::
    AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
             *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938),
            (BaseHandle)(int)((ulong)in_stack_ffffffffffffe940 >> 0x20));
    pfVar5 = OpenMesh::VectorT<float,_3>::operator[]
                       ((VectorT<float,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    fVar2 = *pfVar5;
    local_184 = local_88[0].idx_;
    OpenMesh::
    AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
             *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938),
            (BaseHandle)(int)((ulong)in_stack_ffffffffffffe940 >> 0x20));
    pfVar5 = OpenMesh::VectorT<float,_3>::operator[]
                       ((VectorT<float,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::VectorT<float,float,float,void,void>(local_178,fVar1,fVar2,*pfVar5)
    ;
    local_1a4 = local_88[1].idx_;
    OpenMesh::
    AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
             *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938),
            (BaseHandle)(int)((ulong)in_stack_ffffffffffffe940 >> 0x20));
    pfVar5 = OpenMesh::VectorT<float,_3>::operator[]
                       ((VectorT<float,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    fVar1 = *pfVar5;
    local_1a8 = local_88[1].idx_;
    OpenMesh::
    AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
             *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938),
            (BaseHandle)(int)((ulong)in_stack_ffffffffffffe940 >> 0x20));
    pfVar5 = OpenMesh::VectorT<float,_3>::operator[]
                       ((VectorT<float,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    fVar2 = *pfVar5;
    local_1ac = local_88[1].idx_;
    OpenMesh::
    AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
             *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938),
            (BaseHandle)(int)((ulong)in_stack_ffffffffffffe940 >> 0x20));
    pfVar5 = OpenMesh::VectorT<float,_3>::operator[]
                       ((VectorT<float,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::VectorT<float,float,float,void,void>(local_1a0,fVar1,fVar2,*pfVar5)
    ;
    local_1cc = local_88[2].idx_;
    OpenMesh::
    AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
             *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938),
            (BaseHandle)(int)((ulong)in_stack_ffffffffffffe940 >> 0x20));
    pfVar5 = OpenMesh::VectorT<float,_3>::operator[]
                       ((VectorT<float,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    fVar1 = *pfVar5;
    local_1d0 = local_88[2].idx_;
    OpenMesh::
    AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
             *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938),
            (BaseHandle)(int)((ulong)in_stack_ffffffffffffe940 >> 0x20));
    pfVar5 = OpenMesh::VectorT<float,_3>::operator[]
                       ((VectorT<float,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    fVar2 = *pfVar5;
    local_1d4 = local_88[2].idx_;
    OpenMesh::
    AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
             *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938),
            (BaseHandle)(int)((ulong)in_stack_ffffffffffffe940 >> 0x20));
    pfVar5 = OpenMesh::VectorT<float,_3>::operator[]
                       ((VectorT<float,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::VectorT<float,float,float,void,void>(local_1c8,fVar1,fVar2,*pfVar5)
    ;
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    OpenMesh::cross<double,double,3>
              ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
               (VectorT<double,_3> *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    local_210 = OpenMesh::VectorT<double,_3>::norm<double>((VectorT<double,_3> *)0x1cd7a7);
    local_210 = local_210 * 0.5;
    if ((local_210 == 0.0) && (!NAN(local_210))) {
      dVar15 = std::numeric_limits<double>::infinity();
      pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                           in_stack_ffffffffffffe940,
                           CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
      *pSVar11 = dVar15;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
                ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_ffffffffffffe940,
                 (Matrix<double,__1,_1,_0,__1,_1> *)
                 CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
      goto LAB_001d0ef9;
    }
    OpenMesh::cross<double,double,3>
              ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
               (VectorT<double,_3> *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    local_238 = OpenMesh::VectorT<double,_3>::norm<double>((VectorT<double,_3> *)0x1cd873);
    local_238 = local_238 * 0.5;
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    dVar15 = OpenMesh::dot<double,3>
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    OpenMesh::cross<double,double,3>
              ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
               (VectorT<double,_3> *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    local_258 = OpenMesh::VectorT<double,_3>::norm<double>((VectorT<double,_3> *)0x1cd964);
    local_258 = dVar15 / local_258;
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    dVar15 = OpenMesh::dot<double,3>
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    OpenMesh::cross<double,double,3>
              ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
               (VectorT<double,_3> *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    local_2d8 = OpenMesh::VectorT<double,_3>::norm<double>((VectorT<double,_3> *)0x1cda56);
    local_2d8 = dVar15 / local_2d8;
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    dVar15 = OpenMesh::dot<double,3>
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    OpenMesh::cross<double,double,3>
              ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
               (VectorT<double,_3> *)CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    local_358 = OpenMesh::VectorT<double,_3>::norm<double>((VectorT<double,_3> *)0x1cdb48);
    local_358 = dVar15 / local_358;
    local_3d8 = (local_238 * local_238) / (local_210 * local_210) + 1.0;
    local_3e8 = OpenMesh::VectorT<double,_3>::norm<double>((VectorT<double,_3> *)0x1cdbb2);
    dVar15 = sq<double>(&local_3e8);
    local_3f0 = OpenMesh::VectorT<double,_3>::norm<double>((VectorT<double,_3> *)0x1cdbf4);
    dVar16 = sq<double>(&local_3f0);
    local_3f8 = OpenMesh::VectorT<double,_3>::norm<double>((VectorT<double,_3> *)0x1cdc36);
    dVar17 = sq<double>(&local_3f8);
    local_400 = OpenMesh::VectorT<double,_3>::norm<double>((VectorT<double,_3> *)0x1cdc78);
    dVar12 = sq<double>(&local_400);
    dVar13 = OpenMesh::dot<double,3>
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar14 = OpenMesh::dot<double,3>
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    local_3e0 = ((dVar15 * dVar16 + dVar17 * dVar12) - (dVar13 + dVar13) * dVar14) /
                (local_238 * 4.0);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    pdVar9 = OpenMesh::VectorT<double,_3>::operator[]
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar9;
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    pdVar9 = OpenMesh::VectorT<double,_3>::operator[]
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,2>::VectorT<double,double,void,void>
              ((VectorT<double,2> *)&local_410,-dVar15,*pdVar9);
    pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar9;
    pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::VectorT<double,double,float,void,void>
              (local_458,dVar15,*pdVar9,0.0);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    dVar15 = OpenMesh::dot<double,3>
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    if (dVar15 < 0.0) {
      vVar20 = OpenMesh::VectorT<double,_2>::operator-
                         ((VectorT<double,_2> *)in_stack_ffffffffffffe960);
      local_480 = vVar20.values_._M_elems[0];
      local_478 = vVar20.values_._M_elems[1];
      local_410 = local_480;
      local_408 = local_478;
    }
    local_498 = -(local_238 * local_238) / (local_210 * local_210 * local_210);
    tVar21 = OpenMesh::operator*((double *)in_stack_ffffffffffffe940,
                                 (VectorT<double,_2> *)
                                 CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    local_490 = tVar21.values_._M_elems[0];
    local_488 = tVar21.values_._M_elems[1];
    local_4e8 = -local_358;
    OpenMesh::operator*((double *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::operator*((double *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    local_520 = local_2d8 + local_358;
    OpenMesh::operator*((double *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::operator+
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    tVar21 = OpenMesh::VectorT<double,2>::operator*
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                        (double *)in_stack_ffffffffffffe940);
    local_540 = tVar21.values_._M_elems[0];
    local_538 = tVar21.values_._M_elems[1];
    pdVar9 = OpenMesh::VectorT<double,_3>::operator[]
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar9;
    pdVar9 = OpenMesh::VectorT<double,_3>::operator[]
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,2>::VectorT<double,double,void,void>(local_560,dVar15,*pdVar9);
    tVar21 = OpenMesh::VectorT<double,2>::operator*
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                        (double *)in_stack_ffffffffffffe940);
    local_550 = tVar21.values_._M_elems[0];
    local_548 = tVar21.values_._M_elems[1];
    tVar21 = OpenMesh::VectorT<double,2>::operator+
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                        (VectorT<double,_2> *)in_stack_ffffffffffffe940);
    local_530 = tVar21.values_._M_elems[0];
    local_528 = tVar21.values_._M_elems[1];
    pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar9;
    OpenMesh::BaseHandle::idx(local_88);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         in_stack_ffffffffffffe940,
                         CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    *pSVar11 = *pSVar11 + dVar15;
    pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar9;
    OpenMesh::BaseHandle::idx(local_88);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         in_stack_ffffffffffffe940,
                         CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    *pSVar11 = *pSVar11 + dVar15;
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    pdVar9 = OpenMesh::VectorT<double,_3>::operator[]
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar9;
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    pdVar9 = OpenMesh::VectorT<double,_3>::operator[]
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,2>::VectorT<double,double,void,void>
              ((VectorT<double,2> *)&local_570,-dVar15,*pdVar9);
    pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar9;
    pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::VectorT<double,double,float,void,void>
              (local_5b8,dVar15,*pdVar9,0.0);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    dVar15 = OpenMesh::dot<double,3>
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    if (dVar15 < 0.0) {
      vVar20 = OpenMesh::VectorT<double,_2>::operator-
                         ((VectorT<double,_2> *)in_stack_ffffffffffffe960);
      local_5e0 = vVar20.values_._M_elems[0];
      local_5d8 = vVar20.values_._M_elems[1];
      local_570 = local_5e0;
      local_568 = local_5d8;
    }
    local_5f8 = -(local_238 * local_238) / (local_210 * local_210 * local_210);
    tVar21 = OpenMesh::operator*((double *)in_stack_ffffffffffffe940,
                                 (VectorT<double,_2> *)
                                 CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    local_5f0 = tVar21.values_._M_elems[0];
    local_5e8 = tVar21.values_._M_elems[1];
    local_648 = -local_358;
    OpenMesh::operator*((double *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::operator*((double *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    local_680 = local_258 + local_358;
    OpenMesh::operator*((double *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::operator+
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    tVar21 = OpenMesh::VectorT<double,2>::operator*
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                        (double *)in_stack_ffffffffffffe940);
    local_6a0 = tVar21.values_._M_elems[0];
    local_698 = tVar21.values_._M_elems[1];
    pdVar9 = OpenMesh::VectorT<double,_3>::operator[]
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar9;
    pdVar9 = OpenMesh::VectorT<double,_3>::operator[]
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,2>::VectorT<double,double,void,void>(local_6c0,dVar15,*pdVar9);
    tVar21 = OpenMesh::VectorT<double,2>::operator*
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                        (double *)in_stack_ffffffffffffe940);
    local_6b0 = tVar21.values_._M_elems[0];
    local_6a8 = tVar21.values_._M_elems[1];
    tVar21 = OpenMesh::VectorT<double,2>::operator+
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                        (VectorT<double,_2> *)in_stack_ffffffffffffe940);
    local_690 = tVar21.values_._M_elems[0];
    local_688 = tVar21.values_._M_elems[1];
    pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar9;
    OpenMesh::BaseHandle::idx(local_88 + 1);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         in_stack_ffffffffffffe940,
                         CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    *pSVar11 = *pSVar11 + dVar15;
    pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar9;
    OpenMesh::BaseHandle::idx(local_88 + 1);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         in_stack_ffffffffffffe940,
                         CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    *pSVar11 = *pSVar11 + dVar15;
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    pdVar9 = OpenMesh::VectorT<double,_3>::operator[]
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar9;
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    pdVar9 = OpenMesh::VectorT<double,_3>::operator[]
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,2>::VectorT<double,double,void,void>
              ((VectorT<double,2> *)&local_6d0,-dVar15,*pdVar9);
    pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar9;
    pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::VectorT<double,double,float,void,void>
              (local_718,dVar15,*pdVar9,0.0);
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    dVar15 = OpenMesh::dot<double,3>
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    if (dVar15 < 0.0) {
      vVar20 = OpenMesh::VectorT<double,_2>::operator-
                         ((VectorT<double,_2> *)in_stack_ffffffffffffe960);
      local_740 = vVar20.values_._M_elems[0];
      local_738 = vVar20.values_._M_elems[1];
      local_6d0 = local_740;
      local_6c8 = local_738;
    }
    local_758 = -(local_238 * local_238) / (local_210 * local_210 * local_210);
    tVar21 = OpenMesh::operator*((double *)in_stack_ffffffffffffe940,
                                 (VectorT<double,_2> *)
                                 CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    local_750 = tVar21.values_._M_elems[0];
    local_748 = tVar21.values_._M_elems[1];
    local_7a8 = -local_258;
    OpenMesh::operator*((double *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::operator*((double *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::operator-
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    local_7e0 = local_258 + local_2d8;
    OpenMesh::operator*((double *)in_stack_ffffffffffffe940,
                        (VectorT<double,_3> *)
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,3>::operator+
              (in_stack_ffffffffffffe960,(VectorT<double,_3> *)in_stack_ffffffffffffe958);
    tVar21 = OpenMesh::VectorT<double,2>::operator*
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                        (double *)in_stack_ffffffffffffe940);
    local_800 = tVar21.values_._M_elems[0];
    local_7f8 = tVar21.values_._M_elems[1];
    pdVar9 = OpenMesh::VectorT<double,_3>::operator[]
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar9;
    pdVar9 = OpenMesh::VectorT<double,_3>::operator[]
                       ((VectorT<double,_3> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    OpenMesh::VectorT<double,2>::VectorT<double,double,void,void>(local_820,dVar15,*pdVar9);
    tVar21 = OpenMesh::VectorT<double,2>::operator*
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                        (double *)in_stack_ffffffffffffe940);
    local_810 = tVar21.values_._M_elems[0];
    local_808 = tVar21.values_._M_elems[1];
    tVar21 = OpenMesh::VectorT<double,2>::operator+
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe948,
                        (VectorT<double,_2> *)in_stack_ffffffffffffe940);
    local_7f0 = tVar21.values_._M_elems[0];
    local_7e8 = tVar21.values_._M_elems[1];
    pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar9;
    OpenMesh::BaseHandle::idx(local_88 + 2);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         in_stack_ffffffffffffe940,
                         CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    *pSVar11 = *pSVar11 + dVar15;
    pdVar9 = OpenMesh::VectorT<double,_2>::operator[]
                       ((VectorT<double,_2> *)in_stack_ffffffffffffe940,
                        CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    dVar15 = *pdVar9;
    OpenMesh::BaseHandle::idx(local_88 + 2);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         in_stack_ffffffffffffe940,
                         CONCAT44(in_stack_ffffffffffffe93c,in_stack_ffffffffffffe938));
    *pSVar11 = dVar15 + *pSVar11;
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)in_stack_ffffffffffffe940);
  } while( true );
}

Assistant:

auto calcGrad(const Mesh& mesh, const Eigen::VectorXd& x, double epsilon) {
    // update the hashmap for computing the energy and gradient
    initHashMap(mesh, x, epsilon);
    // the energy term
    Eigen::VectorXd gradx(x.size());
    gradx.setZero();
    // the gradient for distortion term
    for (auto f: mesh.all_faces()) {
        Mesh::VertexHandle vs[3];
        int i = 0;
        for (auto itr = mesh.cfv_ccwbegin(f); itr != mesh.cfv_ccwend(f); itr++)
            vs[i++] = *itr;
        OpenMesh::Vec3d u0(x[2 * vs[0].idx()], x[2 * vs[0].idx() + 1], 0.0);
        OpenMesh::Vec3d u1(x[2 * vs[1].idx()], x[2 * vs[1].idx() + 1], 0.0);
        OpenMesh::Vec3d u2(x[2 * vs[2].idx()], x[2 * vs[2].idx() + 1], 0.0);
        OpenMesh::Vec3d ue1 = u1 - u0;
        OpenMesh::Vec3d ue2 = u2 - u0;

        OpenMesh::Vec3d p0(mesh.point(vs[0])[0], mesh.point(vs[0])[1], mesh.point(vs[0])[2]);
        OpenMesh::Vec3d p1(mesh.point(vs[1])[0], mesh.point(vs[1])[1], mesh.point(vs[1])[2]);
        OpenMesh::Vec3d p2(mesh.point(vs[2])[0], mesh.point(vs[2])[1], mesh.point(vs[2])[2]);
        OpenMesh::Vec3d pe1 = p1 - p0;
        OpenMesh::Vec3d pe2 = p2 - p0;

        // calculate the area of corresponding triangle
        double su = 0.5 * OpenMesh::cross(ue1, ue2).norm();
        if (su == 0.0) {
            gradx[0] = std::numeric_limits<double>::infinity();
            return std::move(gradx);
        }
        double sp = 0.5 * OpenMesh::cross(pe1, pe2).norm();

        double cot0 = OpenMesh::dot(p1 - p0, p2 - p0) / OpenMesh::cross(p1 - p0, p2 - p0).norm();
        double cot1 = OpenMesh::dot(p2 - p1, p0 - p1) / OpenMesh::cross(p2 - p1, p0 - p1).norm();
        double cot2 = OpenMesh::dot(p1 - p2, p0 - p2) / OpenMesh::cross(p1 - p2, p0 - p2).norm();
        
        double term1 = (1 + (sp * sp) / (su * su));
        double term2 = (sq(ue2.norm()) * sq(pe1.norm()) + sq(ue1.norm()) * sq(pe2.norm()) - 2.0f * dot(ue2, ue1) * dot(pe2, pe1)) / (4.0f * sp);

        {
            // dE / du0
            OpenMesh::Vec2d height(-(u2 - u1)[1], (u2 - u1)[0]);
            if (OpenMesh::dot(OpenMesh::Vec3d(height[0], height[1], 0.0f), u0 - u1) < 0.0f)  {
                height = -height;
            }
            OpenMesh::Vec2d dterm1_du0 = - (sp* sp) / (su * su * su) * height;
            OpenMesh::Vec3d dterm2_du0 = -cot2 * u1 - cot1 * u2 + (cot1 + cot2) * u0;
            OpenMesh::Vec2d dE_du0 = dterm1_du0 * term2 + OpenMesh::Vec2d(dterm2_du0[0], dterm2_du0[1]) * term1; 
            gradx[vs[0].idx() * 2] += dE_du0[0];
            gradx[vs[0].idx() * 2 + 1] += dE_du0[1];
        }

        {
            // dE / du1
            OpenMesh::Vec2d height(-(u0 - u2)[1], (u0 - u2)[0]);
            if (OpenMesh::dot(OpenMesh::Vec3d(height[0], height[1], 0.0f), u1 - u0) < 0.0f)  {
                height = -height;
            }
            OpenMesh::Vec2d dterm1_du1 = - (sp* sp) / (su * su * su) * height;
            OpenMesh::Vec3d dterm2_du1 = -cot2 * u0 - cot0 * u2 + (cot0 + cot2) * u1;
            OpenMesh::Vec2d dE_du1 = dterm1_du1 * term2 + OpenMesh::Vec2d(dterm2_du1[0], dterm2_du1[1]) * term1; 
            gradx[vs[1].idx() * 2] += dE_du1[0];
            gradx[vs[1].idx() * 2 + 1] += dE_du1[1];
        }

        {
            // dE / du2
            OpenMesh::Vec2d height(-(u1 - u0)[1], (u1 - u0)[0]);
            if (OpenMesh::dot(OpenMesh::Vec3d(height[0], height[1], 0.0f), u2 - u0) < 0.0f)  {
                height = -height;
            }
            OpenMesh::Vec2d dterm1_du2 = -(sp* sp) / (su * su * su) * height;
            OpenMesh::Vec3d dterm2_du2 = -cot0 * u1 - cot1 * u0 + (cot0 + cot1) * u2;
            OpenMesh::Vec2d dE_du2 = dterm1_du2 * term2 + OpenMesh::Vec2d(dterm2_du2[0], dterm2_du2[1]) * term1; 
            gradx[vs[2].idx() * 2] += dE_du2[0];
            gradx[vs[2].idx() * 2 + 1] += dE_du2[1];
        }
    }

    int cnt = 0;
    // the singularity term
    for (auto e: mesh.all_edges())
        if (mesh.is_boundary(e)) {
            double seng = 0.0;
            int ui_idx = -1;

            int st = mesh.to_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
            int end = mesh.from_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
            OpenMesh::Vec2d pst(x[2 * st], x[2 * st + 1]);
            OpenMesh::Vec2d pend(x[2 * end], x[2 * end + 1]);
            OpenMesh::Vec2d edge = pend - pst;

            // The range for neighborhood searching
            int x_st = std::min(x[2 * st], x[2 * end]) / epsilon - 1;
            int x_end = std::max(x[2 * st], x[2 * end]) / epsilon + 1;
            int y_st = std::min(x[2 * st + 1], x[2 * end + 1]) / epsilon - 1;
            int y_end = std::max(x[2 * st + 1], x[2 * end + 1]) / epsilon + 1;
            // conduct neighbor search for neighbor boundaries points
            for (int xs = x_st; xs <= x_end; ++xs)
                for (int y = y_st; y <= y_end; ++y) {
                    auto itr_pr = neighbors.equal_range(OpenMesh::Vec2i(xs, y));
                    for (auto itr = itr_pr.first; itr != itr_pr.second; ++itr)
                        if (itr->second != st && itr->second != end) {
                            OpenMesh::Vec2d point(x[itr->second * 2], x[itr->second * 2 + 1]);
                            double projected = OpenMesh::dot(point - pst, edge) / edge.norm();
                            double dis = getDistance(mesh, x, e, OpenMesh::VertexHandle(itr->second));

                            if (dis == 0.0) {
                                gradx[0] = std::numeric_limits<double>::infinity();
                                return std::move(gradx);
                            }
                            seng = std::max(0.0, epsilon / dis - 1.0);
                            // calculate the gradient
                            ui_idx = itr->second;
                            if (ui_idx != -1 && seng != 0.0) {
                                OpenMesh::Vec2d grad_maxui;
                                OpenMesh::Vec2d grad_maxu1;
                                OpenMesh::Vec2d grad_maxu2;
                                OpenMesh::Vec2d ui(x[ui_idx * 2], x[ui_idx * 2 + 1]);
                                auto u1 = pst;
                                auto u2 = pend;
                                double dis = sqrt(OpenMesh::dot(ui - u1, ui - u1) - projected * projected);
                                
                                if (OpenMesh::dot(point - pend, pst - pend) < 0.0) {
                                    OpenMesh::Vec2d dir_ui = (point - pend).normalize();
                                    OpenMesh::Vec2d dir_u2 = -(point - pend).normalize();
                                    
                                    // dE / du2
                                    gradx[end * 2] += -2.0 * seng * epsilon * dir_u2[0] / (dis * dis);
                                    gradx[end * 2 + 1] +=  -2.0 * seng * epsilon * dir_u2[1] / (dis * dis);

                                    // dE / dui
                                    gradx[ui_idx * 2] += -2.0 * seng * epsilon * dir_ui[0] / (dis * dis);
                                    gradx[ui_idx * 2 + 1] += -2.0 * seng * epsilon * dir_ui[1] / (dis * dis);
                                }
                                else if (OpenMesh::dot(point - pst, pend - pst) < 0.0) {
                                    OpenMesh::Vec2d dir_ui = (point - pst).normalize();
                                    OpenMesh::Vec2d dir_u1 = -(point - pst).normalize();

                                    // dE / du1
                                    gradx[st * 2] += -2.0 * seng * epsilon * dir_u1[0] / (dis * dis);
                                    gradx[st * 2 + 1] +=  -2.0 * seng * epsilon * dir_u1[1] / (dis * dis);

                                    // dE / dui
                                    gradx[ui_idx * 2] += -2.0 * seng * epsilon * dir_ui[0] / (dis * dis);
                                    gradx[ui_idx * 2 + 1] += -2.0 * seng * epsilon * dir_ui[1] / (dis * dis);

                                }
                                else {
                                    double projected = OpenMesh::dot(ui - u1, u2 - u1) / edge.norm();
                                    // the unit vector othorgonal to the edge
                                    auto normal = ui - u1 - (u2 - u1).normalize() * projected;
                                    normal = normal.normalize();
                                    // dE / du2 u2 is the end point of this edge
                                    grad_maxu2 = -2 * seng * epsilon * projected / OpenMesh::dot(u2 - u1, u2 - u1) * normal / (dis * dis);
                                    gradx[end * 2] += grad_maxu2[0];
                                    gradx[end * 2 + 1] += grad_maxu2[1];
                                    // dE / du1 u1 is the start point of this edge
                                    projected = OpenMesh::dot(ui - u2, u1 - u2) / edge.norm();
                                    grad_maxu1 = -2 * seng * epsilon * projected / OpenMesh::dot(u2 - u1, u2 - u1) * normal / (dis * dis);
                                    gradx[st * 2] += grad_maxu1[0];
                                    gradx[st * 2 + 1] += grad_maxu1[1];
                                    // dE / dui ui is the point with maximal distance
                                    grad_maxui = -2 * seng * epsilon * normal / (dis * dis);
                                    gradx[ui_idx * 2] += grad_maxui[0];
                                    gradx[ui_idx * 2 + 1] += grad_maxui[1];
                                }
                            }
                        }
                }
        }
    return std::move(gradx);
}